

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::Unparser::unparseSpecs
          (Unparser *this,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs)

{
  pointer pCVar1;
  ostream *poVar2;
  char *pcVar3;
  pointer pCVar4;
  string local_50;
  
  pCVar4 = (specs->
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (specs->
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pCVar4 == pCVar1) {
      return;
    }
    fill(this,&pCVar4->openFodder,true,true);
    pcVar3 = "if";
    if (pCVar4->kind == IF) {
LAB_001ac7a7:
      std::operator<<(this->o,pcVar3);
      unparse(this,pCVar4->expr,true);
    }
    else if (pCVar4->kind == FOR) {
      std::operator<<(this->o,"for");
      fill(this,&pCVar4->varFodder,true,true);
      poVar2 = this->o;
      encode_utf8(&local_50,&pCVar4->var->name);
      std::operator<<(poVar2,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      fill(this,&pCVar4->inFodder,true,true);
      pcVar3 = "in";
      goto LAB_001ac7a7;
    }
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

void unparseSpecs(const std::vector<ComprehensionSpec> &specs)
    {
        for (const auto &spec : specs) {
            fill(spec.openFodder, true, true);
            switch (spec.kind) {
                case ComprehensionSpec::FOR:
                    o << "for";
                    fill(spec.varFodder, true, true);
                    o << unparse_id(spec.var);
                    fill(spec.inFodder, true, true);
                    o << "in";
                    unparse(spec.expr, true);
                    break;
                case ComprehensionSpec::IF:
                    o << "if";
                    unparse(spec.expr, true);
                    break;
            }
        }
    }